

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O3

bool __thiscall
glcts::ShaderTextureImageSamplesTestBase::buildComputeProgram
          (ShaderTextureImageSamplesTestBase *this,char *cs_body,bool should_link_po,
          bool should_succeed)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  GLint link_status;
  GLint compile_status;
  int local_40;
  int local_3c;
  char *local_38;
  long lVar4;
  
  local_38 = cs_body;
  deinitProgramAndShaderObjects(this);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  GVar2 = (**(code **)(lVar4 + 0x3f0))(0x91b9);
  this->m_cs_id = GVar2;
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                  ,0x60);
  GVar2 = (**(code **)(lVar4 + 0x3c8))();
  this->m_po_id = GVar2;
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                  ,99);
  (**(code **)(lVar4 + 0x12b8))(this->m_cs_id,1,&local_38,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                  ,0x68);
  local_3c = 0;
  (**(code **)(lVar4 + 0x248))(this->m_cs_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glCompileShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                  ,0x6e);
  (**(code **)(lVar4 + 0xa70))(this->m_cs_id,0x8b81,&local_3c);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetShaderiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                  ,0x71);
  iVar1 = local_3c;
  if (local_3c == 1) {
    if (should_succeed) {
      if (should_link_po) {
        (**(code **)(lVar4 + 0x10))(this->m_po_id,this->m_cs_id);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glAttachShader() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x88);
        local_40 = 0;
        (**(code **)(lVar4 + 0xce8))(this->m_po_id);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glLinkProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x8e);
        (**(code **)(lVar4 + 0x9d8))(this->m_po_id,0x8b82,&local_40);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x91);
        if (local_40 != 1) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Program linking failed.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                     ,0x97);
          goto LAB_00a3893f;
        }
      }
LAB_00a388d1:
      return iVar1 == 1;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation has succeeded, even though it should not have.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
               ,0x80);
  }
  else {
    if (!should_succeed) goto LAB_00a388d1;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
               ,0x77);
  }
LAB_00a3893f:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool ShaderTextureImageSamplesTestBase::buildComputeProgram(const char* cs_body, bool should_link_po,
															bool should_succeed)
{
	bool result = false;

	/* Deinitialize any program / shader objects that may have already been initialized
	 * for this test instance.
	 */
	deinitProgramAndShaderObjects();

	/* Create the objects */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Set up the shader object */
	gl.shaderSource(m_cs_id, 1,			/* count */
					&cs_body, DE_NULL); /* length */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	/* Compile the shader object */
	glw::GLint compile_status = GL_FALSE;

	gl.compileShader(m_cs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_cs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status != GL_TRUE)
	{
		if (should_succeed)
		{
			TCU_FAIL("Shader compilation failed.");
		}

		goto end;
	}
	else
	{
		if (!should_succeed)
		{
			TCU_FAIL("Shader compilation has succeeded, even though it should not have.");
		}
	}

	if (should_link_po)
	{
		/* Prepare the program object for linking */
		gl.attachShader(m_po_id, m_cs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

		/* Link the program object */
		glw::GLint link_status = GL_FALSE;

		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

		if (link_status != GL_TRUE)
		{
			if (should_succeed)
			{
				TCU_FAIL("Program linking failed.");
			}

			goto end;
		}
	}

	result = true;
end:
	return result;
}